

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

int __thiscall font2svg::glyph::init(glyph *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  short sVar2;
  FT_Face_conflict pFVar3;
  FT_GlyphSlot_conflict pFVar4;
  FT_Vector *pFVar5;
  long lVar6;
  short *psVar7;
  FT_Pos FVar8;
  FT_Pos FVar9;
  FT_Pos FVar10;
  FT_Pos FVar11;
  FT_Pos FVar12;
  FT_Pos FVar13;
  FT_Pos FVar14;
  undefined4 uVar15;
  short sVar16;
  undefined4 uVar17;
  FT_Error FVar18;
  int iVar19;
  long lVar20;
  ostream *poVar21;
  FT_Pos *pFVar22;
  int i;
  string asStack_458 [32];
  char glyph_name [1024];
  
  this->face = (this->file).face;
  lVar20 = strtol(*(char **)ctx,(char **)0x0,0);
  this->codepoint = (int)lVar20;
  uVar17 = FT_Get_Char_Index(this->face,(long)(int)lVar20);
  puVar1 = &this->field_0xe8;
  poVar21 = std::operator<<((ostream *)puVar1,"<!--\nUnicode requested: ");
  std::operator<<(poVar21,(string *)ctx);
  poVar21 = std::operator<<((ostream *)puVar1," (decimal: ");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,this->codepoint);
  poVar21 = std::operator<<(poVar21," hex: 0x");
  *(uint *)(poVar21 + *(long *)(*(long *)poVar21 + -0x18) + 0x18) =
       *(uint *)(poVar21 + *(long *)(*(long *)poVar21 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,this->codepoint);
  *(uint *)(poVar21 + *(long *)(*(long *)poVar21 + -0x18) + 0x18) =
       *(uint *)(poVar21 + *(long *)(*(long *)poVar21 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::operator<<(poVar21,")");
  poVar21 = std::operator<<((ostream *)puVar1,"\nGlyph index for unicode: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
  FVar18 = FT_Load_Glyph(this->face,uVar17,1);
  this->error = FVar18;
  poVar21 = std::operator<<((ostream *)puVar1,"\nLoad Glyph into Face\'s glyph slot. error code: ");
  std::ostream::operator<<(poVar21,this->error);
  pFVar3 = this->face;
  pFVar4 = pFVar3->glyph;
  this->slot = pFVar4;
  uVar15 = *(undefined4 *)&(pFVar4->outline).field_0x24;
  (this->ftoutline).flags = (pFVar4->outline).flags;
  *(undefined4 *)&(this->ftoutline).field_0x24 = uVar15;
  sVar2 = (pFVar4->outline).n_contours;
  sVar16 = (pFVar4->outline).n_points;
  uVar15 = *(undefined4 *)&(pFVar4->outline).field_0x4;
  pFVar5 = (pFVar4->outline).points;
  psVar7 = (pFVar4->outline).contours;
  (this->ftoutline).tags = (pFVar4->outline).tags;
  (this->ftoutline).contours = psVar7;
  (this->ftoutline).n_contours = sVar2;
  (this->ftoutline).n_points = sVar16;
  *(undefined4 *)&(this->ftoutline).field_0x4 = uVar15;
  (this->ftoutline).points = pFVar5;
  FT_Get_Glyph_Name(pFVar3,uVar17,glyph_name,0x400);
  pFVar4 = this->slot;
  FVar8 = (pFVar4->metrics).height;
  FVar9 = (pFVar4->metrics).horiBearingX;
  FVar10 = (pFVar4->metrics).horiBearingY;
  FVar11 = (pFVar4->metrics).horiAdvance;
  FVar12 = (pFVar4->metrics).vertBearingX;
  FVar13 = (pFVar4->metrics).vertBearingY;
  FVar14 = (pFVar4->metrics).vertAdvance;
  (this->gm).width = (pFVar4->metrics).width;
  (this->gm).height = FVar8;
  (this->gm).horiBearingX = FVar9;
  (this->gm).horiBearingY = FVar10;
  (this->gm).horiAdvance = FVar11;
  (this->gm).vertBearingX = FVar12;
  (this->gm).vertBearingY = FVar13;
  (this->gm).vertAdvance = FVar14;
  poVar21 = std::operator<<((ostream *)puVar1,"\nGlyph Name: ");
  std::operator<<(poVar21,glyph_name);
  poVar21 = std::operator<<((ostream *)puVar1,"\nGlyph Width: ");
  poVar21 = std::ostream::_M_insert<long>((long)poVar21);
  poVar21 = std::operator<<(poVar21," Height: ");
  poVar21 = std::ostream::_M_insert<long>((long)poVar21);
  poVar21 = std::operator<<(poVar21," Hor. Advance: ");
  poVar21 = std::ostream::_M_insert<long>((long)poVar21);
  poVar21 = std::operator<<(poVar21," Vert. Advance: ");
  std::ostream::_M_insert<long>((long)poVar21);
  poVar21 = std::operator<<((ostream *)puVar1,"\nNum points: ");
  std::ostream::operator<<(poVar21,(this->ftoutline).n_points);
  poVar21 = std::operator<<((ostream *)puVar1,"\nNum contours: ");
  std::ostream::operator<<(poVar21,(this->ftoutline).n_contours);
  std::operator<<((ostream *)puVar1,"\nContour endpoint index values:");
  for (lVar20 = 0; lVar20 < (this->ftoutline).n_contours; lVar20 = lVar20 + 1) {
    poVar21 = std::operator<<((ostream *)puVar1," ");
    std::ostream::operator<<(poVar21,(this->ftoutline).contours[lVar20]);
  }
  std::operator<<((ostream *)puVar1,"\n-->\n");
  pFVar5 = (this->ftoutline).points;
  this->ftpoints = pFVar5;
  sVar2 = (this->ftoutline).n_points;
  pFVar22 = &pFVar5->y;
  for (lVar20 = 0; lVar20 < sVar2; lVar20 = lVar20 + 1) {
    *pFVar22 = -*pFVar22;
    pFVar22 = pFVar22 + 2;
  }
  pFVar3 = this->face;
  lVar20 = (pFVar3->bbox).yMin;
  lVar6 = (pFVar3->bbox).yMax;
  this->bbwidth = (int)((pFVar3->bbox).xMax - (pFVar3->bbox).xMin);
  this->bbheight = (int)(lVar6 - lVar20);
  psVar7 = (this->ftoutline).contours;
  this->tags = (this->ftoutline).tags;
  this->contours = psVar7;
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cout,asStack_458);
  iVar19 = std::__cxx11::string::~string(asStack_458);
  return iVar19;
}

Assistant:

void init( std::string unicode_s )
	{
		face = file.face;
		codepoint = strtol( unicode_s.c_str() , NULL, 0 );
		// Load the Glyph into the face's Glyph Slot + print details
		FT_UInt glyph_index = FT_Get_Char_Index( face, codepoint );
		debug << "<!--\nUnicode requested: " << unicode_s;
		debug << " (decimal: " << codepoint << " hex: 0x"
			<< std::hex << codepoint << std::dec << ")";
		debug << "\nGlyph index for unicode: " << glyph_index;
		error = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
		debug << "\nLoad Glyph into Face's glyph slot. error code: " << error;
		slot = face->glyph;
		ftoutline = slot->outline;
		char glyph_name[1024];
		FT_Get_Glyph_Name( face, glyph_index, glyph_name, 1024 );
		gm = slot->metrics;
		debug << "\nGlyph Name: " << glyph_name;
		debug << "\nGlyph Width: " << gm.width
			<< " Height: " << gm.height
			<< " Hor. Advance: " << gm.horiAdvance
			<< " Vert. Advance: " << gm.vertAdvance;

		// Print outline details, taken from the glyph in the slot.
		debug << "\nNum points: " << ftoutline.n_points;
		debug << "\nNum contours: " << ftoutline.n_contours;
		debug << "\nContour endpoint index values:";
		for ( int i = 0 ; i < ftoutline.n_contours ; i++ ) debug << " " << ftoutline.contours[i];
		debug << "\n-->\n";

		// Invert y coordinates (SVG = neg at top, TType = neg at bottom)
		ftpoints = ftoutline.points;
		for ( int i = 0 ; i < ftoutline.n_points ; i++ )
			ftpoints[i].y *= -1;

		bbheight = face->bbox.yMax - face->bbox.yMin;
		bbwidth = face->bbox.xMax - face->bbox.xMin;
		tags = ftoutline.tags;
		contours = ftoutline.contours;
		std::cout << debug.str();
	}